

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::Generator::GeneratingDescriptorProto(Generator *this)

{
  bool bVar1;
  string *psVar2;
  bool local_11;
  Generator *this_local;
  
  psVar2 = FileDescriptor::name_abi_cxx11_(this->file_);
  bVar1 = std::operator==(psVar2,"net/proto2/proto/descriptor.proto");
  local_11 = true;
  if (!bVar1) {
    psVar2 = FileDescriptor::name_abi_cxx11_(this->file_);
    local_11 = std::operator==(psVar2,"google/protobuf/descriptor.proto");
  }
  return local_11;
}

Assistant:

bool Generator::GeneratingDescriptorProto() const {
  return file_->name() == "net/proto2/proto/descriptor.proto" ||
         file_->name() == "google/protobuf/descriptor.proto";
}